

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::IsPlanar(ON_NurbsSurface *this,ON_Plane *plane,double tolerance)

{
  byte bVar1;
  bool bVar2;
  double dVar3;
  double t;
  byte local_1e4;
  byte local_1e3;
  int local_198;
  int local_194;
  int j;
  int i;
  double dStack_188;
  double local_180;
  ON_3dVector local_178;
  byte local_159;
  undefined1 auStack_158 [7];
  bool rc;
  ON_Interval vdom;
  undefined1 local_138 [8];
  ON_Interval udom;
  ON_3dVector dv;
  ON_3dVector du;
  ON_3dVector normal;
  ON_3dPoint cv;
  ON_3dPoint center;
  double d;
  ON_Plane pln;
  double tolerance_local;
  ON_Plane *plane_local;
  ON_NurbsSurface *this_local;
  
  ON_Plane::ON_Plane((ON_Plane *)&d);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,1);
  dVar3 = ON_Interval::ParameterAt((ON_Interval *)local_138,0.5);
  t = ON_Interval::ParameterAt((ON_Interval *)auStack_158,0.5);
  local_159 = ON_Surface::EvNormal
                        (&this->super_ON_Surface,dVar3,t,(ON_3dPoint *)&cv.z,(ON_3dVector *)&dv.z,
                         (ON_3dVector *)(udom.m_t + 1),(ON_3dVector *)&du.z,0,(int *)0x0);
  if ((!(bool)local_159) || (dVar3 = ON_3dVector::Length((ON_3dVector *)&du.z), 0.9 <= dVar3)) {
    d = cv.z;
    pln.zaxis.y = normal.y;
    pln.yaxis.z = du.z;
    pln.zaxis.x = normal.x;
    bVar2 = ON_3dVector::Unitize((ON_3dVector *)&dv.z);
    if (bVar2) {
      pln.xaxis.y = du.y;
      pln.origin.z = dv.z;
      pln.xaxis.x = du.x;
      ON_CrossProduct(&local_178,(ON_3dVector *)&pln.yaxis.z,(ON_3dVector *)&pln.origin.z);
      pln.yaxis.y = local_178.z;
      pln.xaxis.z = local_178.x;
      pln.yaxis.x = local_178.y;
      ON_3dVector::Unitize((ON_3dVector *)&pln.xaxis.z);
      ON_Plane::UpdateEquation((ON_Plane *)&d);
    }
    else {
      bVar2 = ON_3dVector::Unitize((ON_3dVector *)(udom.m_t + 1));
      if (bVar2) {
        pln.yaxis.y = dv.y;
        pln.xaxis.z = udom.m_t[1];
        pln.yaxis.x = dv.x;
        ON_CrossProduct((ON_3dVector *)&j,(ON_3dVector *)&pln.xaxis.z,(ON_3dVector *)&pln.yaxis.z);
        pln.xaxis.y = local_180;
        pln.origin.z = _j;
        pln.xaxis.x = dStack_188;
        ON_3dVector::Unitize((ON_3dVector *)&pln.origin.z);
        ON_Plane::UpdateEquation((ON_Plane *)&d);
      }
      else {
        ON_Plane::CreateFromNormal((ON_Plane *)&d,(ON_3dPoint *)&cv.z,(ON_3dVector *)&du.z);
      }
    }
    if (((2.3283064365386963e-10 < ABS(pln.yaxis.z)) || (2.3283064365386963e-10 < ABS(pln.zaxis.x)))
       || (1.490116119385e-08 < ABS(ABS(pln.zaxis.y) - 1.0))) {
      if (((2.3283064365386963e-10 < ABS(pln.zaxis.x)) ||
          (2.3283064365386963e-10 < ABS(pln.zaxis.y))) ||
         (1.490116119385e-08 < ABS(ABS(pln.yaxis.z) - 1.0))) {
        if (((ABS(pln.zaxis.y) <= 2.3283064365386963e-10) &&
            (ABS(pln.yaxis.z) <= 2.3283064365386963e-10)) &&
           (ABS(ABS(pln.zaxis.x) - 1.0) <= 1.490116119385e-08)) {
          pln.xaxis.x = 0.0;
          pln.yaxis.x = 0.0;
          pln.zaxis.y = 0.0;
          pln.yaxis.z = 0.0;
          pln.zaxis.x = *(double *)(&DAT_00a035b0 + (ulong)(pln.zaxis.x < 0.0) * 8);
          ON_Plane::UpdateEquation((ON_Plane *)&d);
        }
      }
      else {
        pln.origin.z = 0.0;
        pln.xaxis.z = 0.0;
        pln.zaxis.x = 0.0;
        pln.zaxis.y = 0.0;
        pln.yaxis.z = *(double *)(&DAT_00a035b0 + (ulong)(pln.yaxis.z < 0.0) * 8);
        ON_Plane::UpdateEquation((ON_Plane *)&d);
      }
    }
    else {
      pln.xaxis.y = 0.0;
      pln.yaxis.y = 0.0;
      pln.yaxis.z = 0.0;
      pln.zaxis.x = 0.0;
      pln.zaxis.y = *(double *)(&DAT_00a035b0 + (ulong)(pln.zaxis.y < 0.0) * 8);
      ON_Plane::UpdateEquation((ON_Plane *)&d);
    }
    local_194 = 0;
    while( true ) {
      local_1e3 = 0;
      if (local_194 < this->m_cv_count[0]) {
        local_1e3 = local_159;
      }
      if ((local_1e3 & 1) == 0) break;
      local_198 = 0;
      while( true ) {
        local_1e4 = 0;
        if (local_198 < this->m_cv_count[1]) {
          local_1e4 = local_159;
        }
        if ((local_1e4 & 1) == 0) break;
        GetCV(this,local_194,local_198,(ON_3dPoint *)&normal.z);
        dVar3 = ON_Plane::DistanceTo((ON_Plane *)&d,(ON_3dPoint *)&normal.z);
        if (tolerance < ABS(dVar3)) {
          local_159 = 0;
        }
        local_198 = local_198 + 1;
      }
      local_194 = local_194 + 1;
    }
    if (((local_159 & 1) != 0) && (plane != (ON_Plane *)0x0)) {
      memcpy(plane,&d,0x80);
    }
  }
  else {
    local_159 = 0;
  }
  bVar1 = local_159;
  ON_Plane::~ON_Plane((ON_Plane *)&d);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_NurbsSurface::IsPlanar(
      ON_Plane* plane,
      double tolerance
      ) const
{
  ON_Plane pln;
  double d;
  ON_3dPoint center, cv;
  ON_3dVector normal, du, dv;
  ON_Interval udom = Domain(0);
  ON_Interval vdom = Domain(1);
  bool rc = EvNormal( udom.ParameterAt(0.5), vdom.ParameterAt(0.5), center, du, dv, normal );
  if ( rc && normal.Length() < 0.9 )
    rc = false;
  else
  {
    pln.origin = center;
    pln.zaxis = normal;
    if ( du.Unitize() )
    {
      pln.xaxis = du;
      pln.yaxis = ON_CrossProduct( pln.zaxis, pln.xaxis );
      pln.yaxis.Unitize();
      pln.UpdateEquation();
    }
    else if ( dv.Unitize() )
    {
      pln.yaxis = dv;
      pln.xaxis = ON_CrossProduct( pln.yaxis, pln.zaxis );
      pln.xaxis.Unitize();
      pln.UpdateEquation();
    }
    else
    {
      pln.CreateFromNormal( center, normal );
    }

    // 7 July 2006 Dale Lear
    //    Add a slight bias for coordinate axes planes.
    //    This appears to do more good than harm.  The
    //    issue is keeping customers from getting alarmed
    //    when a coordinate they know is "zero" turns out to
    //    be 1e-23.
    if (    fabs(pln.zaxis.x) <= ON_ZERO_TOLERANCE 
         && fabs(pln.zaxis.y) <= ON_ZERO_TOLERANCE
         && fabs(fabs(pln.zaxis.z)-1.0) <= ON_SQRT_EPSILON
       )
    {
      pln.xaxis.z = 0.0;
      pln.yaxis.z = 0.0;
      pln.zaxis.x = 0.0;
      pln.zaxis.y = 0.0;
      pln.zaxis.z = (pln.zaxis.z<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }
    else if (    fabs(pln.zaxis.y) <= ON_ZERO_TOLERANCE 
              && fabs(pln.zaxis.z) <= ON_ZERO_TOLERANCE
              && fabs(fabs(pln.zaxis.x)-1.0) <= ON_SQRT_EPSILON
            )
    {
      pln.xaxis.x = 0.0;
      pln.yaxis.x = 0.0;
      pln.zaxis.y = 0.0;
      pln.zaxis.z = 0.0;
      pln.zaxis.x = (pln.zaxis.x<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }
    else if (    fabs(pln.zaxis.z) <= ON_ZERO_TOLERANCE 
              && fabs(pln.zaxis.x) <= ON_ZERO_TOLERANCE
              && fabs(fabs(pln.zaxis.y)-1.0) <= ON_SQRT_EPSILON
            )
    {
      pln.xaxis.y = 0.0;
      pln.yaxis.y = 0.0;
      pln.zaxis.z = 0.0;
      pln.zaxis.x = 0.0;
      pln.zaxis.y = (pln.zaxis.y<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }

    int i, j;
    for ( i = 0; i < m_cv_count[0] && rc; i++ )
    {
      for ( j = 0; j < m_cv_count[1] && rc; j++ )
      {
        GetCV( i, j, cv );
        d = pln.DistanceTo(cv);
        if ( fabs(d) > tolerance )
          rc = false;
      }
    }

    if ( rc && plane )
      *plane = pln;
  }

  return rc;
}